

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_fp32_to_bf16_row(float *x,ggml_bf16_t *y,int64_t n)

{
  float fVar1;
  long lVar2;
  ushort uVar3;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      fVar1 = x[lVar2];
      if ((uint)ABS(fVar1) < 0x7f800001) {
        uVar3 = (ushort)(((uint)fVar1 >> 0x10 & 1) + (int)fVar1 + 0x7fff >> 0x10);
      }
      else {
        uVar3 = (ushort)((uint)fVar1 >> 0x10) | 0x40;
      }
      y[lVar2].bits = uVar3;
      lVar2 = lVar2 + 1;
    } while (n != lVar2);
  }
  return;
}

Assistant:

void ggml_fp32_to_bf16_row(const float * x, ggml_bf16_t * y, int64_t n) {
  int i = 0;
#if defined(__AVX512BF16__)
  // subnormals are flushed to zero on this platform
  for (; i + 32 <= n; i += 32) {
        _mm512_storeu_si512(
            (__m512i *)(y + i),
            m512i(_mm512_cvtne2ps_pbh(_mm512_loadu_ps(x + i + 16),
                                _mm512_loadu_ps(x + i))));
  }
#endif
    for (; i < n; i++) {
        y[i] = GGML_FP32_TO_BF16(x[i]);
    }
}